

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write-cmake.cpp
# Opt level: O0

bool CMakeWriter::write_app_resource_paths<chibi::StringBuilder>
               (ChibiInfo *chibi_info,StringBuilder *sb,ChibiLibrary *app,
               vector<ChibiLibraryDependency,_std::allocator<ChibiLibraryDependency>_>
               *library_dependencies)

{
  byte bVar1;
  bool bVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  void *pvVar5;
  size_t sVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  reference pCVar9;
  char *pcVar10;
  chibi local_108 [8];
  string resource_paths_base64_1;
  ChibiLibrary *library_1;
  ChibiLibraryDependency *library_dependency_1;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  vector<ChibiLibraryDependency,_std::allocator<ChibiLibraryDependency>_> *__range2_1;
  StringBuilder resource_paths_1;
  string resource_paths_base64;
  ChibiLibrary *library;
  ChibiLibraryDependency *library_dependency;
  const_iterator __end2;
  const_iterator __begin2;
  vector<ChibiLibraryDependency,_std::allocator<ChibiLibraryDependency>_> *__range2;
  undefined1 local_48 [8];
  StringBuilder resource_paths;
  vector<ChibiLibraryDependency,_std::allocator<ChibiLibraryDependency>_>
  *library_dependencies_local;
  ChibiLibrary *app_local;
  StringBuilder *sb_local;
  ChibiInfo *chibi_info_local;
  
  resource_paths._24_8_ = library_dependencies;
  chibi::StringBuilder::StringBuilder((StringBuilder *)local_48);
  chibi::StringBuilder::Append((StringBuilder *)local_48,"type,name,path\n");
  bVar1 = std::__cxx11::string::empty();
  if ((bVar1 & 1) == 0) {
    uVar3 = std::__cxx11::string::c_str();
    uVar4 = std::__cxx11::string::c_str();
    chibi::StringBuilder::AppendFormat((StringBuilder *)local_48,"%s,%s,%s\n","app",uVar3,uVar4);
  }
  uVar3 = resource_paths._24_8_;
  __end2 = std::vector<ChibiLibraryDependency,_std::allocator<ChibiLibraryDependency>_>::begin
                     ((vector<ChibiLibraryDependency,_std::allocator<ChibiLibraryDependency>_> *)
                      resource_paths._24_8_);
  library_dependency =
       (ChibiLibraryDependency *)
       std::vector<ChibiLibraryDependency,_std::allocator<ChibiLibraryDependency>_>::end
                 ((vector<ChibiLibraryDependency,_std::allocator<ChibiLibraryDependency>_> *)uVar3);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<const_ChibiLibraryDependency_*,_std::vector<ChibiLibraryDependency,_std::allocator<ChibiLibraryDependency>_>_>
                                     *)&library_dependency), bVar2) {
    pCVar9 = __gnu_cxx::
             __normal_iterator<const_ChibiLibraryDependency_*,_std::vector<ChibiLibraryDependency,_std::allocator<ChibiLibraryDependency>_>_>
             ::operator*(&__end2);
    if (pCVar9->type == kType_Generated) {
      pcVar10 = (char *)std::__cxx11::string::c_str();
      ChibiInfo::find_library(chibi_info,pcVar10);
      bVar1 = std::__cxx11::string::empty();
      if ((bVar1 & 1) == 0) {
        uVar3 = std::__cxx11::string::c_str();
        uVar4 = std::__cxx11::string::c_str();
        chibi::StringBuilder::AppendFormat
                  ((StringBuilder *)local_48,"%s,%s,%s\n","library",uVar3,uVar4);
      }
    }
    __gnu_cxx::
    __normal_iterator<const_ChibiLibraryDependency_*,_std::vector<ChibiLibraryDependency,_std::allocator<ChibiLibraryDependency>_>_>
    ::operator++(&__end2);
  }
  pvVar5 = (void *)std::__cxx11::string::c_str();
  sVar6 = std::__cxx11::string::size();
  chibi::base64_encode_abi_cxx11_((chibi *)&resource_paths_1.field_0x18,pvVar5,sVar6);
  uVar3 = std::__cxx11::string::c_str();
  uVar4 = std::__cxx11::string::c_str();
  uVar7 = std::__cxx11::string::c_str();
  uVar8 = std::__cxx11::string::c_str();
  chibi::StringBuilder::AppendFormat
            (sb,"target_compile_definitions(%s PRIVATE %sCHIBI_RESOURCE_PATHS=\"%s\"%s)\n",uVar3,
             uVar4,uVar7,uVar8);
  chibi::StringBuilder::Append(sb,"\n");
  std::__cxx11::string::~string((string *)&resource_paths_1.field_0x18);
  chibi::StringBuilder::~StringBuilder((StringBuilder *)local_48);
  chibi::StringBuilder::StringBuilder((StringBuilder *)&__range2_1);
  chibi::StringBuilder::Append((StringBuilder *)&__range2_1,"type,name,path\n");
  uVar3 = resource_paths._24_8_;
  __end2_1 = std::vector<ChibiLibraryDependency,_std::allocator<ChibiLibraryDependency>_>::begin
                       ((vector<ChibiLibraryDependency,_std::allocator<ChibiLibraryDependency>_> *)
                        resource_paths._24_8_);
  library_dependency_1 =
       (ChibiLibraryDependency *)
       std::vector<ChibiLibraryDependency,_std::allocator<ChibiLibraryDependency>_>::end
                 ((vector<ChibiLibraryDependency,_std::allocator<ChibiLibraryDependency>_> *)uVar3);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end2_1,
                            (__normal_iterator<const_ChibiLibraryDependency_*,_std::vector<ChibiLibraryDependency,_std::allocator<ChibiLibraryDependency>_>_>
                             *)&library_dependency_1), bVar2) {
    pCVar9 = __gnu_cxx::
             __normal_iterator<const_ChibiLibraryDependency_*,_std::vector<ChibiLibraryDependency,_std::allocator<ChibiLibraryDependency>_>_>
             ::operator*(&__end2_1);
    if (pCVar9->type == kType_Generated) {
      pcVar10 = (char *)std::__cxx11::string::c_str();
      ChibiInfo::find_library(chibi_info,pcVar10);
      bVar1 = std::__cxx11::string::empty();
      if ((bVar1 & 1) == 0) {
        uVar3 = std::__cxx11::string::c_str();
        uVar4 = std::__cxx11::string::c_str();
        chibi::StringBuilder::AppendFormat
                  ((StringBuilder *)&__range2_1,"%s,%s,libs/%s\n","library",uVar3,uVar4);
      }
    }
    __gnu_cxx::
    __normal_iterator<const_ChibiLibraryDependency_*,_std::vector<ChibiLibraryDependency,_std::allocator<ChibiLibraryDependency>_>_>
    ::operator++(&__end2_1);
  }
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          s_platform_abi_cxx11_,"windows");
  if (bVar2) {
    uVar3 = std::__cxx11::string::c_str();
    chibi::StringBuilder::AppendFormat((StringBuilder *)&__range2_1,"%s,%s,%s\n","app",uVar3,"data")
    ;
  }
  pvVar5 = (void *)std::__cxx11::string::c_str();
  sVar6 = std::__cxx11::string::size();
  chibi::base64_encode_abi_cxx11_(local_108,pvVar5,sVar6);
  uVar3 = std::__cxx11::string::c_str();
  uVar4 = std::__cxx11::string::c_str();
  uVar7 = std::__cxx11::string::c_str();
  uVar8 = std::__cxx11::string::c_str();
  chibi::StringBuilder::AppendFormat
            (sb,"target_compile_definitions(%s PRIVATE %sCHIBI_RESOURCE_PATHS=\"%s\"%s)\n",uVar3,
             uVar4,uVar7,uVar8);
  chibi::StringBuilder::Append(sb,"\n");
  std::__cxx11::string::~string((string *)local_108);
  chibi::StringBuilder::~StringBuilder((StringBuilder *)&__range2_1);
  return true;
}

Assistant:

static bool write_app_resource_paths(
		const ChibiInfo & chibi_info,
		S & sb,
		const ChibiLibrary & app,
		const std::vector<ChibiLibraryDependency> & library_dependencies)
	{
		// write a formatted list of all resource paths to CHIBI_RESOURCE_PATHS

		{
			// for debug/release builds : write the absolute paths to the app/library locations
			// this will allow for real-time editing to work, directly from the original source
			// locations
			
			StringBuilder resource_paths;

			resource_paths.Append("type,name,path\n");

			if (app.resource_path.empty() == false)
			{
				resource_paths.AppendFormat("%s,%s,%s\n",
					"app",
					app.name.c_str(),
					app.resource_path.c_str());
			}

			for (auto & library_dependency : library_dependencies)
			{
				if (library_dependency.type == ChibiLibraryDependency::kType_Generated)
				{
					auto * library = chibi_info.find_library(library_dependency.name.c_str());
					
					if (library->resource_path.empty() == false)
					{
						resource_paths.AppendFormat("%s,%s,%s\n",
							"library",
							library->name.c_str(),
							library->resource_path.c_str());
					}
				}
			}

			const std::string resource_paths_base64 = base64_encode(
				resource_paths.text.c_str(),
				resource_paths.text.size());

			sb.AppendFormat("target_compile_definitions(%s PRIVATE %sCHIBI_RESOURCE_PATHS=\"%s\"%s)\n",
				app.name.c_str(),
				dont_makearchive_conditional_begin.c_str(),
				resource_paths_base64.c_str(),
				dont_makearchive_conditional_end.c_str());
			sb.Append("\n");
		}
		
		{
			// for distribution builds : write the relative paths to the app/library locations
			// inside the app bundle or package location. this will allow for distributing the
			// app with all files located within the same directory structure
			
			StringBuilder resource_paths;

			resource_paths.Append("type,name,path\n");

			for (auto & library_dependency : library_dependencies)
			{
				if (library_dependency.type == ChibiLibraryDependency::kType_Generated)
				{
					auto * library = chibi_info.find_library(library_dependency.name.c_str());
					
					if (library->resource_path.empty() == false)
					{
						resource_paths.AppendFormat("%s,%s,libs/%s\n",
							"library",
							library->name.c_str(),
							library->name.c_str());
					}
				}
			}

			if (s_platform == "windows")
			{
				resource_paths.AppendFormat("%s,%s,%s\n",
					"app",
					app.name.c_str(),
					"data");
			}

			const std::string resource_paths_base64 = base64_encode(
				resource_paths.text.c_str(),
				resource_paths.text.size());

			sb.AppendFormat("target_compile_definitions(%s PRIVATE %sCHIBI_RESOURCE_PATHS=\"%s\"%s)\n",
				app.name.c_str(),
				makearchive_conditional_begin.c_str(),
				resource_paths_base64.c_str(),
				makearchive_conditional_end.c_str());
			sb.Append("\n");
		}
		
		return true;
	}